

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O0

void __thiscall
so_5::impl::disp_repository_t::disp_repository_t
          (disp_repository_t *this,environment_t *env,named_dispatcher_map_t *named_dispatcher_map,
          event_exception_logger_unique_ptr_t *logger)

{
  event_exception_logger_unique_ptr_t *logger_local;
  named_dispatcher_map_t *named_dispatcher_map_local;
  environment_t *env_local;
  disp_repository_t *this_local;
  
  this->_vptr_disp_repository_t = (_func_int **)&PTR__disp_repository_t_005c2598;
  this->m_env = env;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
  ::map(&this->m_named_dispatcher_map,named_dispatcher_map);
  std::mutex::mutex(&this->m_exception_logger_lock);
  std::
  unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>::
  unique_ptr(&this->m_event_exception_logger,logger);
  this->m_state = not_started;
  rw_spinlock_t<so_5::yield_backoff_t>::rw_spinlock_t(&this->m_lock);
  return;
}

Assistant:

disp_repository_t::disp_repository_t(
	environment_t & env,
	named_dispatcher_map_t named_dispatcher_map,
	event_exception_logger_unique_ptr_t logger )
	:	m_env( env )
	,	m_named_dispatcher_map( std::move( named_dispatcher_map ) )
	,	m_event_exception_logger( std::move( logger ) )
	,	m_state( state_t::not_started )
{
}